

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::ActivationParametricSoftplus::ActivationParametricSoftplus
          (ActivationParametricSoftplus *this,ActivationParametricSoftplus *from)

{
  void *pvVar1;
  WeightParams *pWVar2;
  WeightParams *pWVar3;
  
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__ActivationParametricSoftplus_00341ac0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  pWVar2 = from->alpha_;
  if (pWVar2 == (WeightParams *)0x0 ||
      from == (ActivationParametricSoftplus *)&_ActivationParametricSoftplus_default_instance_) {
    pWVar3 = (WeightParams *)0x0;
  }
  else {
    pWVar3 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(pWVar3,pWVar2);
  }
  this->alpha_ = pWVar3;
  pWVar2 = from->beta_;
  if (pWVar2 == (WeightParams *)0x0 ||
      from == (ActivationParametricSoftplus *)&_ActivationParametricSoftplus_default_instance_) {
    pWVar3 = (WeightParams *)0x0;
  }
  else {
    pWVar3 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(pWVar3,pWVar2);
  }
  this->beta_ = pWVar3;
  return;
}

Assistant:

ActivationParametricSoftplus::ActivationParametricSoftplus(const ActivationParametricSoftplus& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_alpha()) {
    alpha_ = new ::CoreML::Specification::WeightParams(*from.alpha_);
  } else {
    alpha_ = NULL;
  }
  if (from.has_beta()) {
    beta_ = new ::CoreML::Specification::WeightParams(*from.beta_);
  } else {
    beta_ = NULL;
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.ActivationParametricSoftplus)
}